

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.cc
# Opt level: O2

void __thiscall
iqxmlrpc::Http_client_connection::handle_input(Http_client_connection *this,bool *param_1)

{
  Connection *pCVar1;
  Reactor_base *pRVar2;
  int iVar3;
  pointer pcVar4;
  undefined4 extraout_var;
  Packet *pPVar5;
  network_error *this_00;
  pointer pcVar6;
  long lVar7;
  allocator<char> local_51;
  string local_50;
  
  pcVar6 = (this->super_Client_connection).read_buf_.super__Vector_base<char,_std::allocator<char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (this->super_Client_connection).read_buf_.super__Vector_base<char,_std::allocator<char>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pcVar4 - (long)pcVar6;
  pCVar1 = &this->super_Connection;
  while ((lVar7 == (long)pcVar4 - (long)pcVar6 && (this->resp_packet == (Packet *)0x0))) {
    iVar3 = (*(pCVar1->super_Event_handler)._vptr_Event_handler[0xd])(pCVar1,pcVar6,lVar7);
    lVar7 = CONCAT44(extraout_var,iVar3);
    if (lVar7 == 0) {
      this_00 = (network_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Connection closed by peer.",&local_51);
      iqnet::network_error::network_error(this_00,&local_50,false,0);
      __cxa_throw(this_00,&iqnet::network_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar6,pcVar6 + lVar7);
    pPVar5 = Client_connection::read_response(&this->super_Client_connection,&local_50,false);
    this->resp_packet = pPVar5;
    std::__cxx11::string::~string((string *)&local_50);
    pcVar6 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pcVar4 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  if (this->resp_packet != (Packet *)0x0) {
    pRVar2 = (this->reactor)._M_ptr;
    (*pRVar2->_vptr_Reactor_base[4])(pRVar2,pCVar1);
  }
  return;
}

Assistant:

void Http_client_connection::handle_input( bool& )
{
  for( size_t sz = read_buf_sz(); (sz == read_buf_sz()) && !resp_packet ; )
  {
    if( !(sz = recv( read_buf(), read_buf_sz() )) )
      throw iqnet::network_error( "Connection closed by peer.", false );

    resp_packet = read_response( std::string(read_buf(), sz) );
  }

  if( resp_packet )
    reactor->unregister_handler( this );
}